

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O3

char * conv_path_to_utf8_with_tmpl
                 (GString *path,char *from_enc,out_fmt fmt_type,StrTransformFunc func,GError **error
                 )

{
  char cVar1;
  GError *pGVar2;
  gchar *pgVar3;
  GError **ppGVar4;
  GQuark GVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  long *plVar9;
  char *pcVar10;
  int *piVar11;
  undefined8 uVar12;
  long *plVar13;
  gchar *pgVar14;
  size_t sVar15;
  ushort uVar16;
  ulong uVar17;
  long lVar18;
  byte bVar19;
  gsize gVar20;
  byte *__s;
  gsize o_left;
  size_t local_88;
  char *o_ptr;
  char **local_78;
  out_fmt local_6c;
  char *i_ptr;
  size_t local_60;
  StrTransformFunc local_58;
  GError **local_50;
  char *local_48;
  size_t local_40;
  _fmt_data *local_38;
  
  local_6c = fmt_type;
  if (path == (GString *)0x0) {
LAB_0010643a:
    conv_path_to_utf8_with_tmpl_cold_6();
  }
  else {
    local_58 = func;
    local_50 = error;
    local_48 = from_enc;
    if (from_enc == (char *)0x0) {
      pcVar10 = path->str;
      local_88 = ucs2_bytelen(pcVar10,path->len);
      local_40 = 2;
      from_enc = "UTF-16LE";
    }
    else {
      if (*from_enc == '\0') {
        g_return_if_fail_warning("rifiuti2","conv_path_to_utf8_with_tmpl","! from_enc || *from_enc")
        ;
        return (char *)0x0;
      }
      pcVar10 = path->str;
      local_88 = strnlen(pcVar10,0x104);
      local_40 = 1;
    }
    i_ptr = pcVar10;
    local_60 = local_88;
    plVar8 = (long *)g_string_sized_new(local_88 + 1);
    gVar20 = ~plVar8[1] + plVar8[2];
    o_ptr = (char *)(plVar8[1] + *plVar8);
    o_left = gVar20;
    local_78 = (char **)g_iconv_open("UTF-8",from_enc);
    g_log("rifiuti2",0x80,"Initial : r=%02zu, w=%02zu/%02zu",local_60,gVar20,plVar8[2] + -1);
    plVar9 = (long *)g_ptr_array_new_with_free_func(g_free);
    if (local_60 == 0) {
      lVar18 = -1;
      sVar15 = 0;
    }
    else {
      local_38 = fmt + local_6c;
      sVar15 = local_60;
      do {
        if ((*i_ptr == '\0') &&
           ((lVar18 = -1, gVar20 = o_left, local_48 != (char *)0x0 || (i_ptr[1] == '\0'))))
        goto LAB_00106250;
        lVar18 = g_iconv(local_78,&i_ptr,&local_88,&o_ptr,&o_left);
        sVar15 = local_88;
        plVar8[1] = ~o_left + plVar8[2];
        pcVar10 = (char *)(~o_left + plVar8[2] + *plVar8);
        if (o_ptr != pcVar10) {
          conv_path_to_utf8_with_tmpl_cold_1();
LAB_00106435:
          conv_path_to_utf8_with_tmpl_cold_4();
          goto LAB_0010643a;
        }
        *pcVar10 = '\0';
        gVar20 = o_left;
        if (lVar18 != -1) goto LAB_00106250;
        piVar11 = __errno_location();
        gVar20 = o_left;
        iVar6 = *piVar11;
        lVar18 = plVar8[2];
        uVar12 = g_strerror(iVar6);
        g_log("rifiuti2",0x80,"Progress: r=%02zu, w=%02zu/%02zu, status=%zd (%s), str=%s",sVar15,
              gVar20,lVar18 + -1,0xffffffffffffffff,uVar12,*plVar8);
        if (iVar6 == 7) {
          plVar8 = (long *)g_string_set_size(plVar8,plVar8[2] * 2);
          o_left = ~plVar8[1] + plVar8[2];
          o_ptr = (char *)(plVar8[1] + *plVar8);
        }
        else if ((iVar6 == 0x54) || (iVar6 == 0x16)) {
          plVar13 = (long *)g_malloc(8);
          *plVar13 = local_60 - local_88;
          g_ptr_array_add(plVar9,plVar13);
          if (local_88 == 0) {
            conv_path_to_utf8_with_tmpl_cold_3();
          }
          else if (i_ptr == (char *)0x0) {
            conv_path_to_utf8_with_tmpl_cold_2();
          }
          else {
            sVar15 = local_88;
            if (local_88 != 1) {
              sVar15 = local_40;
            }
            if (sVar15 == 1) {
              uVar16 = (ushort)(byte)*i_ptr;
            }
            else {
              uVar16 = *(ushort *)i_ptr;
            }
            g_string_append_printf(plVar8,local_38->fallback_tmpl[sVar15],uVar16);
            i_ptr = i_ptr + sVar15;
            local_88 = local_88 - sVar15;
          }
          o_left = ~plVar8[1] + plVar8[2];
          o_ptr = (char *)(plVar8[1] + *plVar8);
          g_log("rifiuti2",0x80,"Progress: r=%02zu, w=%02zu/%02zu, str=%s",local_88,o_left,
                plVar8[2] + -1,*plVar8);
          g_iconv(local_78,0,0,&o_ptr,&o_left);
          plVar8[1] = ~o_left + plVar8[2];
          pcVar10 = (char *)(~o_left + plVar8[2] + *plVar8);
          if (o_ptr != pcVar10) goto LAB_00106435;
          *pcVar10 = '\0';
        }
        sVar15 = local_88;
      } while (local_88 != 0);
      lVar18 = -1;
      sVar15 = 0;
      gVar20 = o_left;
    }
LAB_00106250:
    g_log("rifiuti2",0x80,"Finally : r=%02zu, w=%02zu/%02zu, status=%zd, str=%s",sVar15,gVar20,
          plVar8[2] + -1,lVar18,*plVar8);
    g_iconv_close(local_78);
    ppGVar4 = local_50;
    if (local_50 != (GError **)0x0) {
      pGVar2 = *local_50;
      GVar5 = rifiuti_record_error_quark();
      iVar6 = g_error_matches(pGVar2,GVar5,3);
      if ((iVar6 != 0) && ((int)plVar9[1] != 0)) {
        pgVar3 = (*ppGVar4)->message;
        uVar12 = g_string_new(pgVar3);
        uVar12 = g_string_append(uVar12,", at offset:");
        if ((int)plVar9[1] != 0) {
          uVar17 = 0;
          do {
            g_string_append_printf(uVar12," %zu",**(undefined8 **)(*plVar9 + uVar17 * 8));
            uVar17 = uVar17 + 1;
          } while (uVar17 < *(uint *)(plVar9 + 1));
        }
        pgVar14 = (gchar *)g_string_free(uVar12,0);
        (*local_50)->message = pgVar14;
        g_free(pgVar3);
      }
    }
    g_ptr_array_free(plVar9,1);
    iVar6 = g_utf8_validate(*plVar8,0xffffffffffffffff,0);
    if (iVar6 != 0) {
      __s = (byte *)*plVar8;
      if (local_58 == (StrTransformFunc)0x0) {
        sVar15 = strlen((char *)__s);
        uVar12 = g_string_sized_new(sVar15 * 2);
        lVar18 = _g_utf8_skip;
        bVar19 = *__s;
        if (bVar19 != 0) {
          local_78 = fmt[local_6c].fallback_tmpl;
          do {
            iVar6 = g_utf8_get_char(__s);
            cVar1 = *(char *)(lVar18 + (ulong)bVar19);
            iVar7 = g_unichar_isgraph(iVar6);
            if ((iVar6 == 0x20) || (iVar7 != 0)) {
              uVar12 = g_string_append_len(uVar12,__s,(long)cVar1);
            }
            else {
              g_string_append_printf(uVar12,*local_78,iVar6);
            }
            __s = __s + cVar1;
            bVar19 = *__s;
          } while (bVar19 != 0);
        }
        pcVar10 = (char *)g_string_free(uVar12,0);
      }
      else {
        pcVar10 = (*local_58)((char *)__s);
      }
      g_string_free(plVar8,1);
      return pcVar10;
    }
    conv_path_to_utf8_with_tmpl_cold_5();
  }
  return (char *)0x0;
}

Assistant:

char *
conv_path_to_utf8_with_tmpl (const GString   *path,
                             const char      *from_enc,
                             out_fmt          fmt_type,
                             StrTransformFunc func,
                             GError         **error)
{
    char            *i_ptr,
                    *o_ptr,
                    *result;
    gsize            i_size,
                     i_left,
                     o_left,
                     char_sz,
                     status;
    GIConv           conv;
    GPtrArray       *err_offsets;
    GString         *s;

    // For unicode path, the first char must be ASCII drive letter
    // or slash. And since it is in little endian, first byte is
    // always non-null
    g_return_val_if_fail (path != NULL, NULL);
    g_return_val_if_fail (! from_enc || *from_enc, NULL);

    if (from_enc)
    {
        char_sz = sizeof (char);
        i_left = i_size = strnlen (path->str, WIN_PATH_MAX);
    }
    else
    {
        char_sz = sizeof (gunichar2);
        i_left = i_size = ucs2_bytelen (path->str, path->len);
    }
    i_ptr = path->str;

    // Ballpark figure, GString decides alloc size on its own
    s = g_string_sized_new (i_size + 1);
    _sync_pos (s, &o_left, &o_ptr, true);

    // Shouldn't fail, encoding already tested upon start of prog
    conv = g_iconv_open ("UTF-8", from_enc ? from_enc : "UTF-16LE");

    g_debug ("Initial : r=%02zu, w=%02zu/%02zu",
        i_left, o_left, s->allocated_len - 1);
    err_offsets = g_ptr_array_new_with_free_func ((GDestroyNotify) g_free);

    // Pass 1: Convert to UTF-8, all illegal seq become escaped hex

    while (i_left > 0)
    {
        if (*i_ptr == '\0') {
            if (from_enc   != NULL) break;
            if (*(i_ptr+1) == '\0') break; /* utf-16: check "\0\0" */
        }

        // When non-reversible char are converted to \uFFFD, there
        // is nothing we can do. Just accept the status quo.
        status = g_iconv (conv, &i_ptr, &i_left, &o_ptr, &o_left);
        _sync_pos (s, &o_left, &o_ptr, false);
        if (status != (gsize) -1)
            break;

        int e = errno;
        g_debug ("Progress: r=%02zu, w=%02zu/%02zu, status=%zd (%s), str=%s",
            i_left, o_left, s->allocated_len - 1,
            status, g_strerror(e), s->str);

        switch (e)
        {
        case EINVAL:
        case EILSEQ:
        {
            size_t *processed = g_malloc (sizeof (size_t));
            *processed = i_size - i_left;
            g_ptr_array_add (err_offsets, processed);
        }
            _advance_octet (char_sz, &i_ptr, &i_left, s, fmt_type);
            _sync_pos (s, &o_left, &o_ptr, true);
            g_debug ("Progress: r=%02zu, w=%02zu/%02zu, str=%s",
                i_left, o_left, s->allocated_len - 1, s->str);
            g_iconv (conv, NULL, NULL, &o_ptr, &o_left);  // reset state
            _sync_pos (s, &o_left, &o_ptr, false);
            break;
        case E2BIG:
            s = g_string_set_size (s, s->allocated_len * 2);
            _sync_pos (s, &o_left, &o_ptr, true);
            break;
        }
    }

    g_debug ("Finally : r=%02zu, w=%02zu/%02zu, status=%zd, str=%s",
        i_left, o_left, s->allocated_len - 1, status, s->str);

    g_iconv_close (conv);

    if (error &&
        g_error_matches ((const GError *) (*error),
            R2_REC_ERROR, R2_REC_ERROR_CONV_PATH) &&
        err_offsets->len > 0)
    {
        // More detailed error message showing offsets
        char *old = (*error)->message;
        GString *dbg_str = g_string_new ((const char *) old);
        dbg_str = g_string_append (dbg_str, ", at offset:");
        for (size_t i = 0; i < err_offsets->len; i++)
        {
            g_string_append_printf (dbg_str, " %zu",
                *((size_t *) (err_offsets->pdata[i])));
        }
        (*error)->message = g_string_free (dbg_str, FALSE);
        g_free (old);
    }

    g_ptr_array_free (err_offsets, TRUE);

    // Pass 2: Post processing, e.g. convert non-printable chars to hex

    g_return_val_if_fail (g_utf8_validate (s->str, -1, NULL), NULL);

    if (func == NULL)
        result = _filter_printable_char (s->str, fmt_type);
    else
        result = func (s->str);
    g_string_free (s, TRUE);

    return result;
}